

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderInterfaceCompatibility.cpp
# Opt level: O0

void __thiscall
Rml::RenderInterfaceAdapter::RenderToClipMask
          (RenderInterfaceAdapter *this,ClipMaskOperation operation,CompiledGeometryHandle handle,
          Vector2f translation)

{
  Vector2Type VVar1;
  RenderInterfaceCompatibility *pRVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  const_reference pvVar8;
  reference pVVar9;
  Rectangle<float> local_a0;
  undefined1 local_90 [8];
  Rectanglei scissor;
  Vertex *vertex;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<Vertex> *__range1;
  undefined1 local_40 [8];
  Rectanglef rectangle;
  AdaptedGeometry *geometry;
  CompiledGeometryHandle handle_local;
  ClipMaskOperation operation_local;
  RenderInterfaceAdapter *this_local;
  Vector2f translation_local;
  
  if ((operation == Set) || (operation != SetInverse)) {
    rectangle.p1 = (Vector2Type)handle;
    pvVar8 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::operator[]
                       ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)handle,0);
    VVar1.x = (pvVar8->position).x;
    VVar1.y = (pvVar8->position).y;
    _local_40 = Rectangle<float>::FromPosition(VVar1);
    VVar1 = rectangle.p1;
    __end1 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::begin
                       ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)rectangle.p1);
    vertex = (Vertex *)
             ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::end
                       ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)VVar1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
                                       *)&vertex), bVar3) {
      pVVar9 = __gnu_cxx::
               __normal_iterator<const_Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
               ::operator*(&__end1);
      scissor.p1.x = (pVVar9->position).x;
      scissor.p1.y = (pVVar9->position).y;
      _local_40 = Rectangle<float>::Join((Rectangle<float> *)local_40,(Vector2Type)scissor.p1);
      __gnu_cxx::
      __normal_iterator<const_Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
      ::operator++(&__end1);
    }
    local_a0 = Rectangle<float>::Translate((Rectangle<float> *)local_40,translation);
    _local_90 = Rectangle::operator_cast_to_Rectangle((Rectangle *)&local_a0);
    pRVar2 = this->legacy;
    uVar4 = Rectangle<int>::Left((Rectangle<int> *)local_90);
    uVar5 = Rectangle<int>::Top((Rectangle<int> *)local_90);
    uVar6 = Rectangle<int>::Width((Rectangle<int> *)local_90);
    uVar7 = Rectangle<int>::Height((Rectangle<int> *)local_90);
    (*pRVar2->_vptr_RenderInterfaceCompatibility[7])
              (pRVar2,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
  }
  return;
}

Assistant:

void RenderInterfaceAdapter::RenderToClipMask(ClipMaskOperation operation, CompiledGeometryHandle handle, Vector2f translation)
{
	switch (operation)
	{
	case ClipMaskOperation::Set:
	case ClipMaskOperation::Intersect:
		// Intersect is considered like Set. This typically occurs in nested clipping situations, which never worked
		// correctly in legacy.
		break;
	case ClipMaskOperation::SetInverse:
		// Using features not supported in legacy, bail out.
		return;
	}

	// New features can render more complex clip masks, while legacy only supported rectangle scissoring. Find the
	// geometry's rectangular coverage.
	const AdaptedGeometry* geometry = reinterpret_cast<AdaptedGeometry*>(handle);

	Rectanglef rectangle = Rectanglef::FromPosition(geometry->vertices[0].position);
	for (const Vertex& vertex : geometry->vertices)
		rectangle = rectangle.Join(vertex.position);

	const Rectanglei scissor = Rectanglei(rectangle.Translate(translation));
	legacy.SetScissorRegion(scissor.Left(), scissor.Top(), scissor.Width(), scissor.Height());
}